

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeClose(Btree *p)

{
  int iVar1;
  BtShared *pBt;
  Btree *pBVar2;
  Btree *pBVar3;
  bool bVar4;
  BtShared *pBVar5;
  int extraout_EAX;
  sqlite3_mutex *psVar6;
  BtShared **ppBVar7;
  BtShared *pBVar8;
  
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  sqlite3BtreeRollback(p,0,0);
  sqlite3BtreeLeave(p);
  if (p->sharable != '\0') {
    bVar4 = true;
    if (sqlite3Config.bCoreMutex == '\0') {
LAB_0013d084:
      psVar6 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar6 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      if (psVar6 == (sqlite3_mutex *)0x0) goto LAB_0013d084;
      (*sqlite3Config.mutex.xMutexEnter)(psVar6);
      bVar4 = false;
    }
    iVar1 = pBt->nRef;
    pBt->nRef = iVar1 + -1;
    if (iVar1 < 2) {
      pBVar5 = sqlite3SharedCacheList;
      if (sqlite3SharedCacheList == pBt) {
        ppBVar7 = &sqlite3SharedCacheList;
      }
      else {
        do {
          pBVar8 = pBVar5;
          if (pBVar8 == (BtShared *)0x0) goto LAB_0013d0cb;
          pBVar5 = pBVar8->pNext;
        } while (pBVar8->pNext != pBt);
        ppBVar7 = &pBVar8->pNext;
      }
      *ppBVar7 = pBt->pNext;
LAB_0013d0cb:
      if (pBt->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)(pBt->mutex);
      }
    }
    if (!bVar4) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar6);
    }
    if (1 < iVar1) goto LAB_0013d128;
  }
  sqlite3PagerClose(pBt->pPager,p->db);
  if ((pBt->xFreeSchema != (_func_void_void_ptr *)0x0) && (pBt->pSchema != (void *)0x0)) {
    (*pBt->xFreeSchema)(pBt->pSchema);
  }
  sqlite3DbFree((sqlite3 *)0x0,pBt->pSchema);
  freeTempSpace(pBt);
  sqlite3_free(pBt);
LAB_0013d128:
  pBVar2 = p->pNext;
  pBVar3 = p->pPrev;
  if (pBVar3 != (Btree *)0x0) {
    pBVar3->pNext = pBVar2;
  }
  if (pBVar2 != (Btree *)0x0) {
    pBVar2->pPrev = pBVar3;
  }
  sqlite3_free(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClose(Btree *p){
  BtShared *pBt = p->pBt;

  /* Close all cursors opened via this handle.  */
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);

  /* Verify that no other cursors have this Btree open */
#ifdef SQLITE_DEBUG
  {
    BtCursor *pCur = pBt->pCursor;
    while( pCur ){
      BtCursor *pTmp = pCur;
      pCur = pCur->pNext;
      assert( pTmp->pBtree!=p );

    }
  }
#endif

  /* Rollback any active transaction and free the handle structure.
  ** The call to sqlite3BtreeRollback() drops any table-locks held by
  ** this handle.
  */
  sqlite3BtreeRollback(p, SQLITE_OK, 0);
  sqlite3BtreeLeave(p);

  /* If there are still other outstanding references to the shared-btree
  ** structure, return now. The remainder of this procedure cleans
  ** up the shared-btree.
  */
  assert( p->wantToLock==0 && p->locked==0 );
  if( !p->sharable || removeFromSharingList(pBt) ){
    /* The pBt is no longer on the sharing list, so we can access
    ** it without having to hold the mutex.
    **
    ** Clean out and delete the BtShared object.
    */
    assert( !pBt->pCursor );
    sqlite3PagerClose(pBt->pPager, p->db);
    if( pBt->xFreeSchema && pBt->pSchema ){
      pBt->xFreeSchema(pBt->pSchema);
    }
    sqlite3DbFree(0, pBt->pSchema);
    freeTempSpace(pBt);
    sqlite3_free(pBt);
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  assert( p->wantToLock==0 );
  assert( p->locked==0 );
  if( p->pPrev ) p->pPrev->pNext = p->pNext;
  if( p->pNext ) p->pNext->pPrev = p->pPrev;
#endif

  sqlite3_free(p);
  return SQLITE_OK;
}